

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicyULT.cpp
# Opt level: O0

void __thiscall CTestGen12CachePolicy::CheckLlcEdramCachePolicy(CTestGen12CachePolicy *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_4e0;
  Message local_4d8;
  uint local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_24;
  Message local_4b0;
  uint local_4a4;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_23;
  Message local_488;
  uint local_47c;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_22;
  Message local_460;
  uint local_454;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_21;
  Message local_438;
  uint local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_20;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_19;
  Message local_3e8;
  int local_3dc;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_18;
  Message local_3c0;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_17;
  Message local_398;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_16;
  ulong local_370;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_15;
  ulong local_348;
  Message local_340;
  ulong local_338;
  undefined4 local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_14;
  ulong local_310;
  Message local_308;
  int local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_13;
  GMM_CACHE_POLICY_ELEMENT MOCS61;
  ulong local_2b8;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_12;
  ulong local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_11;
  ulong local_260;
  Message local_258;
  int local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_10;
  GMM_CACHE_POLICY_ELEMENT MOCS63;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_9;
  Message local_1e0;
  uint local_1d4;
  ulong local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_8;
  Message local_1b0;
  uint local_1a4;
  ulong local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_7;
  Message local_180;
  uint local_178 [2];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_6;
  Message local_158;
  uint local_150 [2];
  undefined1 local_148 [8];
  AssertionResult gtest_ar_5;
  Message local_130;
  uint local_128 [2];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108;
  uint local_100 [2];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  uint local_d8 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  uint local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  uint local_78 [2];
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  GMM_CACHE_POLICY_TBL_ELEMENT Mocs;
  uint32_t AssignedMocsIdx;
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint32_t Usage;
  uint32_t LeCC_WT_CACHEABLE;
  uint32_t LeCC_WB_CACHEABLE;
  uint32_t LeCC_WC_UNCACHEABLE;
  uint32_t LeCC_UNCACHEABLE;
  uint32_t TargetCache_LLC;
  CTestGen12CachePolicy *this_local;
  
  LeCC_WC_UNCACHEABLE = 1;
  LeCC_WB_CACHEABLE = 0;
  LeCC_WT_CACHEABLE = 1;
  Usage = 3;
  ClientRequest.IsOverridenByRegkey = 2;
  _LeCC_UNCACHEABLE = this;
  for (ClientRequest.Override = 0; ClientRequest.Override < 0x11e;
      ClientRequest.Override = ClientRequest.Override + 1) {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (&Mocs.L3,CommonULT::pGmmULTClientContext,ClientRequest.Override);
    Mocs.LeCC.DwordValue = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    register0x00000000 =
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))
                   (CommonULT::pGmmULTClientContext,Mocs.LeCC.DwordValue);
    local_78[1] = 0;
    local_78[0] = gtest_ar.message_.ptr_._4_4_ >> 6 & 1;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_70,"0",(int *)"Mocs.LeCC.AOM",local_78 + 1,local_78);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(local_90);
      pMVar2 = testing::Message::operator<<(local_90,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": AOM is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    local_b0[1] = 0;
    local_b0[0] = gtest_ar.message_.ptr_._4_4_ >> 0xf & 3;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_a8,"0",(int *)"Mocs.LeCC.CoS",local_b0 + 1,local_b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pMVar2 = testing::Message::operator<<(&local_b8,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": CoS is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    local_d8[1] = 0;
    local_d8[0] = gtest_ar.message_.ptr_._4_4_ >> 0xb & 7;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_d0,"0",(int *)"Mocs.LeCC.PFM",local_d8 + 1,local_d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pMVar2 = testing::Message::operator<<(&local_e0,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": PFM is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    local_100[1] = 0;
    local_100[0] = gtest_ar.message_.ptr_._4_4_ >> 8 & 7;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_f8,"0",(int *)"Mocs.LeCC.SCC",local_100 + 1,local_100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pMVar2 = testing::Message::operator<<(&local_108,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": SCC is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_108);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    local_128[1] = 0;
    local_128[0] = gtest_ar.message_.ptr_._4_4_ >> 0xe &
                   (uint)((*(uint *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_1 >> 10 & 1) == 0)
    ;
    testing::internal::EqHelper<true>::Compare<int,int>
              ((char *)local_120,"0",
               (int *)
               "Mocs.LeCC.SCF & !const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLLCBypass"
               ,(int *)(local_128 + 1),local_128);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pMVar2 = testing::Message::operator<<(&local_130,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": SCF is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_130);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    local_150[1] = 0;
    local_150[0] = gtest_ar.message_.ptr_._4_4_ >> 7 & 1;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_148,"0",(int *)"Mocs.LeCC.ESC",local_150 + 1,local_150);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pMVar2 = testing::Message::operator<<(&local_158,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": ESC is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa2,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    local_178[1] = 0;
    local_178[0] = gtest_ar.message_.ptr_._4_4_ >> 0x13;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_170,"0",(int *)"Mocs.LeCC.Reserved",local_178 + 1,local_178);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pMVar2 = testing::Message::operator<<(&local_180,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [29])0x228425);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    local_1a0 = (ulong)(((ushort)ClientRequest.IDCode & 0x30) >> 4);
    local_1a4 = gtest_ar.message_.ptr_._4_4_ >> 4 & 3;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
              ((EqHelper<false> *)local_198,"ClientRequest.AGE","Mocs.LeCC.LRUM",&local_1a0,
               &local_1a4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pMVar2 = testing::Message::operator<<(&local_1b0,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [25])": Incorrect AGE settings");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa6,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
    local_1d0 = (ulong)(ClientRequest.IDCode._2_2_ & 3);
    local_1d4 = gtest_ar.message_.ptr_._4_4_ >> 0x11 & 3;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
              ((EqHelper<false> *)local_1c8,"ClientRequest.SSO","Mocs.LeCC.SelfSnoop",&local_1d0,
               &local_1d4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      pMVar2 = testing::Message::operator<<(&local_1e0,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [25])": Self Snoop is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    local_1fc = 0x40;
    testing::internal::CmpHelperGT<int,unsigned_int>
              ((internal *)local_1f8,"(64)","AssignedMocsIdx",&local_1fc,(uint *)&Mocs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_208);
      pMVar2 = testing::Message::operator<<(&local_208,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<
                         (pMVar2,(char (*) [43])": MOCS Index greater than MAX allowed (63)");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&MOCS63.Override,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xac,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&MOCS63.Override,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&MOCS63.Override);
      testing::Message::~Message(&local_208);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    if ((ClientRequest.IDCode._2_2_ >> 3 & 3) == 2) {
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
                (&gtest_ar_10.message_,CommonULT::pGmmULTClientContext,0x3a);
      if (ClientRequest.Override == 0x3a) {
        local_24c = 0x3f;
        testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                  ((EqHelper<false> *)local_248,"AssignedMocsIdx","63",(uint *)&Mocs,&local_24c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
        if (!bVar1) {
          testing::Message::Message(&local_258);
          pMVar2 = testing::Message::operator<<(&local_258,(char (*) [8])"Usage# ");
          pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
          pMVar2 = testing::Message::operator<<
                             (pMVar2,(char (*) [40])": Incorrect Index for L3Eviction type# ");
          local_260 = (ulong)(((ClientRequest.IDCode._2_2_ & 0x18) << 0x10) >> 0x13);
          pMVar2 = testing::Message::operator<<(pMVar2,&local_260);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb3,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,pMVar2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_258);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      }
      else {
        MOCS63.IDCode._0_1_ = (byte)MOCS63.IDCode | 4;
        local_27c = 0x3f;
        testing::internal::CmpHelperNE<unsigned_int,int>
                  ((internal *)local_278,"AssignedMocsIdx","63",(uint *)&Mocs,&local_27c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
        if (!bVar1) {
          testing::Message::Message(&local_288);
          pMVar2 = testing::Message::operator<<(&local_288,(char (*) [8])"Usage# ");
          pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
          pMVar2 = testing::Message::operator<<
                             (pMVar2,(char (*) [40])": Incorrect Index for L3Eviction type# ");
          local_290 = (ulong)(((ClientRequest.IDCode._2_2_ & 0x18) << 0x10) >> 0x13);
          pMVar2 = testing::Message::operator<<(pMVar2,&local_290);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb8,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,pMVar2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(&local_288);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_2a8,"MOCS63.Value","ClientRequest.Value",
                   (unsigned_long *)&MOCS63,(unsigned_long *)&ClientRequest);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
        if (!bVar1) {
          testing::Message::Message(&local_2b0);
          pMVar2 = testing::Message::operator<<(&local_2b0,(char (*) [8])"Usage# ");
          pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
          pMVar2 = testing::Message::operator<<
                             (pMVar2,(char (*) [40])": Incorrect usage for L3Eviction type# ");
          local_2b8 = (ulong)(((ClientRequest.IDCode._2_2_ & 0x18) << 0x10) >> 0x13);
          pMVar2 = testing::Message::operator<<(pMVar2,&local_2b8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&MOCS61.Override,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb9,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&MOCS61.Override,pMVar2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&MOCS61.Override);
          testing::Message::~Message(&local_2b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
      }
    }
    else if ((ClientRequest.IDCode._2_2_ >> 3 & 3) == 3) {
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
                (&gtest_ar_13.message_,CommonULT::pGmmULTClientContext,0x3b);
      local_2fc = 0x3d;
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                ((EqHelper<false> *)local_2f8,"AssignedMocsIdx","61",(uint *)&Mocs,&local_2fc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
      if (!bVar1) {
        testing::Message::Message(&local_308);
        pMVar2 = testing::Message::operator<<(&local_308,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [40])": Incorrect Index for L3Eviction type# ");
        local_310 = (ulong)(((ClientRequest.IDCode._2_2_ & 0x18) << 0x10) >> 0x13);
        pMVar2 = testing::Message::operator<<(pMVar2,&local_310);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xbf,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
        testing::Message::~Message(&local_308);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
      local_32c = 0;
      local_338 = (ulong)((ushort)ClientRequest.IDCode & 1);
      testing::internal::EqHelper<true>::Compare<int,unsigned_long>
                ((char *)local_328,"0",(int *)"ClientRequest.LLC",(unsigned_long *)&local_32c,
                 &local_338);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
      if (!bVar1) {
        testing::Message::Message(&local_340);
        pMVar2 = testing::Message::operator<<(&local_340,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [51])
                                   ": Incorrect LLC cacheability for L3Eviction type# ");
        local_348 = (ulong)(((ClientRequest.IDCode._2_2_ & 0x18) << 0x10) >> 0x13);
        pMVar2 = testing::Message::operator<<(pMVar2,&local_348);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc0,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
        testing::Message::~Message(&local_340);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_360,"MOCS61.Value","ClientRequest.Value",
                 (unsigned_long *)&MOCS61,(unsigned_long *)&ClientRequest);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
      if (!bVar1) {
        testing::Message::Message(&local_368);
        pMVar2 = testing::Message::operator<<(&local_368,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [40])": Incorrect usage for L3Eviction type# ");
        local_370 = (ulong)(((ClientRequest.IDCode._2_2_ & 0x18) << 0x10) >> 0x13);
        pMVar2 = testing::Message::operator<<(pMVar2,&local_370);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc1,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
        testing::Message::~Message(&local_368);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    }
    else if (ClientRequest.Override == 0x1d) {
      local_38c = 0x3c;
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                ((EqHelper<false> *)local_388,"AssignedMocsIdx","60",(uint *)&Mocs,&local_38c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
      if (!bVar1) {
        testing::Message::Message(&local_398);
        pMVar2 = testing::Message::operator<<(&local_398,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [26])": Incorrect Index for CCS");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc5,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
        testing::Message::~Message(&local_398);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
    }
    else if (ClientRequest.Override == 0x39) {
      local_3b4 = 0x3e;
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                ((EqHelper<false> *)local_3b0,"AssignedMocsIdx","62",(uint *)&Mocs,&local_3b4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
      if (!bVar1) {
        testing::Message::Message(&local_3c0);
        pMVar2 = testing::Message::operator<<(&local_3c0,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [30])": Incorrect Index for MOCS_62")
        ;
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc9,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
        testing::Message::~Message(&local_3c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
    }
    else if ((ClientRequest.IDCode._2_2_ >> 2 & 1) == 0) {
      local_404 = 0x30;
      testing::internal::CmpHelperLT<unsigned_int,int>
                ((internal *)local_400,"AssignedMocsIdx","(48)",(uint *)&Mocs,&local_404);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
      if (!bVar1) {
        testing::Message::Message(&local_410);
        pMVar2 = testing::Message::operator<<(&local_410,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [36])": Incorrect Index for HDCL1 setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xd2,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
        testing::Message::~Message(&local_410);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
    }
    else {
      local_3dc = 0x30;
      testing::internal::CmpHelperGE<unsigned_int,int>
                ((internal *)local_3d8,"AssignedMocsIdx","(48)",(uint *)&Mocs,&local_3dc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
      if (!bVar1) {
        testing::Message::Message(&local_3e8);
        pMVar2 = testing::Message::operator<<(&local_3e8,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [36])": Incorrect Index for HDCL1 setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xce,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
        testing::Message::~Message(&local_3e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
    }
    if ((((ushort)ClientRequest.IDCode & 1) == 0) && (((ushort)ClientRequest.IDCode & 2) == 0)) {
      local_42c = gtest_ar.message_.ptr_._4_4_ & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_428,"LeCC_WC_UNCACHEABLE","Mocs.LeCC.Cacheability",
                 &LeCC_WT_CACHEABLE,&local_42c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
      if (!bVar1) {
        testing::Message::Message(&local_438);
        pMVar2 = testing::Message::operator<<(&local_438,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [42])": Incorrect LLC/eDRAM cachebility setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xd7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
        testing::Message::~Message(&local_438);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    }
    else if (((ushort)ClientRequest.IDCode & 1) == 0) {
      local_4a4 = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_4a0,"TargetCache_LLC","Mocs.LeCC.TargetCache",
                 &LeCC_WC_UNCACHEABLE,&local_4a4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
      if (!bVar1) {
        testing::Message::Message(&local_4b0);
        pMVar2 = testing::Message::operator<<(&local_4b0,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [33])": Incorrect target cache setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xe3,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
        testing::Message::~Message(&local_4b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
      local_4cc = gtest_ar.message_.ptr_._4_4_ & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_4c8,"LeCC_WC_UNCACHEABLE","Mocs.LeCC.Cacheability",
                 &LeCC_WT_CACHEABLE,&local_4cc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
      if (!bVar1) {
        testing::Message::Message(&local_4d8);
        pMVar2 = testing::Message::operator<<(&local_4d8,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [36])": Incorrect LLC cachebility setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xe5,pcVar3);
        testing::internal::AssertHelper::operator=(&local_4e0,pMVar2);
        testing::internal::AssertHelper::~AssertHelper(&local_4e0);
        testing::Message::~Message(&local_4d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
    }
    else {
      local_454 = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_450,"TargetCache_LLC","Mocs.LeCC.TargetCache",
                 &LeCC_WC_UNCACHEABLE,&local_454);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
      if (!bVar1) {
        testing::Message::Message(&local_460);
        pMVar2 = testing::Message::operator<<(&local_460,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [33])": Incorrect target cache setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xdd,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
        testing::Message::~Message(&local_460);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
      local_47c = gtest_ar.message_.ptr_._4_4_ & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_478,"LeCC_WB_CACHEABLE","Mocs.LeCC.Cacheability",&Usage,
                 &local_47c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
      if (!bVar1) {
        testing::Message::Message(&local_488);
        pMVar2 = testing::Message::operator<<(&local_488,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [36])": Incorrect LLC cachebility setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xdf,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
        testing::Message::~Message(&local_488);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
    }
  }
  return;
}

Assistant:

void CTestGen12CachePolicy::CheckLlcEdramCachePolicy()
{
    const uint32_t TargetCache_LLC = 1;

    const uint32_t LeCC_UNCACHEABLE    = 0x0;
    const uint32_t LeCC_WC_UNCACHEABLE = 0x1;
    const uint32_t LeCC_WB_CACHEABLE   = 0x3;
    const uint32_t LeCC_WT_CACHEABLE   = 0x2;

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                        AssignedMocsIdx = ClientRequest.MemoryObjectOverride.Gen12.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);

        // Check for unused fields
        EXPECT_EQ(0, Mocs.LeCC.AOM) << "Usage# " << Usage << ": AOM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.CoS) << "Usage# " << Usage << ": CoS is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.PFM) << "Usage# " << Usage << ": PFM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        // SCF field might be set for LKF/Gen12+ platforms;
        EXPECT_EQ(0, Mocs.LeCC.SCF & !const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLLCBypass) << "Usage# " << Usage << ": SCF is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";

        // Check for age
        EXPECT_EQ(ClientRequest.AGE, Mocs.LeCC.LRUM) << "Usage# " << Usage << ": Incorrect AGE settings";

        // Check for Snoop Setting
        EXPECT_EQ(ClientRequest.SSO, Mocs.LeCC.SelfSnoop) << "Usage# " << Usage << ": Self Snoop is non-zero";

        // Check if Mocs Index is not greater than GMM_MAX_NUMBER_MOCS_INDEXES
        EXPECT_GT(GMM_MAX_NUMBER_MOCS_INDEXES, AssignedMocsIdx) << "Usage# " << Usage << ": MOCS Index greater than MAX allowed (63)";

        if(ClientRequest.L3Eviction == 0x2) //63
        {
            GMM_CACHE_POLICY_ELEMENT MOCS63 = pGmmULTClientContext->GetCachePolicyElement(GMM_RESOURCE_USAGE_L3_EVICTION);
            if((GMM_RESOURCE_USAGE_TYPE)Usage == GMM_RESOURCE_USAGE_L3_EVICTION)
            {
                EXPECT_EQ(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
            }
            else
            {
                MOCS63.L3 = 1; //Override L3 to test , since Hw forces it to L3-uncached
                EXPECT_NE(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
                EXPECT_EQ(MOCS63.Value, ClientRequest.Value) << "Usage# " << Usage << ": Incorrect usage for L3Eviction type# " << ClientRequest.L3Eviction;
            }
        }
        else if(ClientRequest.L3Eviction == 0x3) //61
        {
            GMM_CACHE_POLICY_ELEMENT MOCS61 = pGmmULTClientContext->GetCachePolicyElement(GMM_RESOURCE_USAGE_L3_EVICTION_SPECIAL);
            EXPECT_EQ(AssignedMocsIdx, 61) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
            EXPECT_EQ(0, ClientRequest.LLC) << "Usage# " << Usage << ": Incorrect LLC cacheability for L3Eviction type# " << ClientRequest.L3Eviction;
            EXPECT_EQ(MOCS61.Value, ClientRequest.Value) << "Usage# " << Usage << ": Incorrect usage for L3Eviction type# " << ClientRequest.L3Eviction;
        }
        else if(Usage == GMM_RESOURCE_USAGE_CCS) //60
        {
            EXPECT_EQ(AssignedMocsIdx, 60) << "Usage# " << Usage << ": Incorrect Index for CCS";
        }
        else if(Usage == GMM_RESOURCE_USAGE_MOCS_62) //62
        {
            EXPECT_EQ(AssignedMocsIdx, 62) << "Usage# " << Usage << ": Incorrect Index for MOCS_62";
        }
        // Check of assigned Index setting is appropriate for HDCL1 setting
        else if(ClientRequest.HDCL1)
        {
            EXPECT_GE(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }
        else
        {
            EXPECT_LT(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }

        if(!ClientRequest.LLC && !ClientRequest.ELLC) // Uncached
        {
            EXPECT_EQ(LeCC_WC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC/eDRAM cachebility setting";
        }
        else
        {
            if(ClientRequest.LLC) // LLC only
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";

                EXPECT_EQ(LeCC_WB_CACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC cachebility setting";
            }
            else
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";

                EXPECT_EQ(LeCC_WC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC cachebility setting";
            }
        }
    }
}